

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fakeit.hpp
# Opt level: O2

void __thiscall
fakeit::
MethodMockingContext<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::MethodMockingContext
          (MethodMockingContext<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,void **vtt,Context *stubbingContext)

{
  _func_int **pp_Var1;
  Implementation *this_00;
  
  (this->super_Sequence)._vptr_Sequence = (_func_int **)&PTR__Sequence_0012d500;
  (this->super_ActualInvocationsSource)._vptr_ActualInvocationsSource =
       (_func_int **)&PTR___cxa_pure_virtual_0012b0a0;
  (this->super_Matcher)._vptr_Matcher = (_func_int **)&PTR__Matcher_0012d538;
  pp_Var1 = (_func_int **)*vtt;
  (this->super_Sequence)._vptr_Sequence = pp_Var1;
  (this->super_ActualInvocationsSource)._vptr_ActualInvocationsSource =
       (_func_int **)(MethodMockingContext<std::__cxx11::string>::vtable + 0x88);
  *(void **)(pp_Var1[-3] + (long)&(this->super_Sequence)._vptr_Sequence) = vtt[1];
  *(void **)((this->super_Sequence)._vptr_Sequence[-4] +
            (long)&(this->super_Sequence)._vptr_Sequence) = vtt[2];
  (this->super_Matcher)._vptr_Matcher =
       (_func_int **)(MethodMockingContext<std::__cxx11::string>::vtable + 0xb0);
  this_00 = (Implementation *)operator_new(0x20);
  Implementation::Implementation(this_00,stubbingContext);
  std::
  __shared_ptr<fakeit::MethodMockingContext<std::__cxx11::string>::Implementation,(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr<fakeit::MethodMockingContext<std::__cxx11::string>::Implementation,void>
            ((__shared_ptr<fakeit::MethodMockingContext<std::__cxx11::string>::Implementation,(__gnu_cxx::_Lock_policy)2>
              *)&this->_impl,this_00);
  return;
}

Assistant:

MethodMockingContext(Context *stubbingContext)
                : _impl{new Implementation(stubbingContext)} {
        }